

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirentryinfo_p.h
# Opt level: O1

void __thiscall QDirEntryInfo::~QDirEntryInfo(QDirEntryInfo *this)

{
  Data *pDVar1;
  Data *pDVar2;
  
  if ((this->fileInfoOpt).super__Optional_base<QFileInfo,_false,_false>._M_payload.
      super__Optional_payload<QFileInfo,_true,_false,_false>.super__Optional_payload_base<QFileInfo>
      ._M_engaged == true) {
    (this->fileInfoOpt).super__Optional_base<QFileInfo,_false,_false>._M_payload.
    super__Optional_payload<QFileInfo,_true,_false,_false>.super__Optional_payload_base<QFileInfo>.
    _M_engaged = false;
    QFileInfo::~QFileInfo((QFileInfo *)&this->fileInfoOpt);
  }
  pDVar1 = (this->entry).m_nativeFilePath.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->entry).m_nativeFilePath.d.d)->super_QArrayData,1,0x10);
    }
  }
  pDVar2 = (this->entry).m_filePath.d.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value =
         (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type_conflict *)&(pDVar2->super_QArrayData).ref_._q_value ==
        (__atomic_base<int>)0x0) {
      QArrayData::deallocate(&((this->entry).m_filePath.d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

const QFileSystemMetaData &ensureFilled(QFileSystemMetaData::MetaDataFlags what)
    {
        if (!metaData.hasFlags(what))
            QFileSystemEngine::fillMetaData(entry, metaData, what);
        return metaData;
    }